

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffdtdmll(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,LONGLONG *naxes,
            int *status)

{
  int iVar1;
  tcolumn *ptVar2;
  char *pcVar3;
  long lVar4;
  tcolumn *__s;
  long lVar5;
  double dVar6;
  tcolumn *local_98;
  tcolumn *local_90;
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  __s = fptr->Fptr->tableptr + (uint)colnum;
  if (*tdimstr == '\0') {
    *naxis = 1;
    if (0 < maxdim) {
      *naxes = __s[-1].trepeat;
    }
LAB_0016ff8c:
    return *status;
  }
  *naxis = 0;
  ptVar2 = (tcolumn *)strchr(tdimstr,0x28);
  if (ptVar2 != (tcolumn *)0x0) {
    lVar5 = 1;
    local_90 = __s;
    while (ptVar2 != (tcolumn *)0x0) {
      local_98 = (tcolumn *)(ptVar2->ttype + 1);
      dVar6 = strtod((char *)local_98,(char **)&local_98);
      __s = local_98;
      lVar4 = (long)(dVar6 + 0.1);
      iVar1 = *naxis;
      if (iVar1 < maxdim) {
        naxes[iVar1] = lVar4;
      }
      if (lVar4 < 0) {
        ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
        ffpmsg(tdimstr);
        goto LAB_00170030;
      }
      lVar5 = lVar5 * lVar4;
      *naxis = iVar1 + 1;
      ptVar2 = (tcolumn *)strchr(local_98->ttype,0x2c);
      local_98 = ptVar2;
    }
    pcVar3 = strchr(__s->ttype,0x29);
    if (pcVar3 != (char *)0x0) {
      if ((0 < local_90[-1].tdatatype) && (local_90[-1].trepeat != lVar5)) {
        snprintf(message,0x51,"column vector length, %.0f, does not equal TDIMn array size, %.0f",
                 (double)local_90[-1].trepeat,(double)lVar5);
        ffpmsg(message);
        ffpmsg(tdimstr);
        *status = 0x107;
        return 0x107;
      }
      goto LAB_0016ff8c;
    }
  }
  snprintf(message,0x51,"Illegal TDIM keyword value: %s",tdimstr);
LAB_00170030:
  *status = 0x107;
  return 0x107;
}

Assistant:

int ffdtdmll(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
*/
{
    LONGLONG dimsize;
    LONGLONG totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr;
    double doublesize;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
    {
        *naxis = 1;                   /* default = 1 dimensional */
        if (maxdim > 0)
            naxes[0] = colptr->trepeat; /* default length = repeat */
    }
    else
    {
        *naxis = 0;

        loc = strchr(tdimstr, '(' );  /* find the opening quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        while (loc)
        {
            loc++;

    /* Read value as a double because the string to 64-bit int function is  */
    /* platform dependent (strtoll, strtol, _atoI64).  This still gives     */
    /* about 48 bits of precision, which is plenty for this purpose.        */

            doublesize = strtod(loc, &loc);
            dimsize = (LONGLONG) (doublesize + 0.1);

            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
        }

        loc = strchr(lastloc, ')' );  /* check for the closing quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        if ((colptr->tdatatype > 0) && (colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %.0f, does not equal TDIMn array size, %.0f",
          (double) (colptr->trepeat), (double) totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}